

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_frontend.cpp
# Opt level: O2

void __thiscall
basisu::basisu_frontend::compute_endpoint_clusters_within_each_parent_cluster(basisu_frontend *this)

{
  vector<basisu::vector<unsigned_int>_> *this_00;
  undefined8 in_RAX;
  vec2U *pvVar1;
  byte *pbVar2;
  vector<unsigned_int> *pvVar3;
  uint *pFirst;
  uint32_t block_index;
  ulong uVar4;
  uint32_t cluster_index;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  generate_block_endpoint_clusters(this);
  this_00 = &this->m_endpoint_clusters_within_each_parent_cluster;
  vector<basisu::vector<unsigned_int>_>::resize(this_00,0,false);
  vector<basisu::vector<unsigned_int>_>::resize
            (this_00,(ulong)(this->m_endpoint_parent_clusters).m_size,false);
  for (uVar4 = 0; uVar4 < this->m_total_blocks; uVar4 = uVar4 + 1) {
    pvVar1 = vector<basisu::vec2U>::operator[](&this->m_block_endpoint_clusters_indices,uVar4);
    uStack_38 = CONCAT44(pvVar1->m_comps[0],(undefined4)uStack_38);
    pbVar2 = vector<unsigned_char>::operator[](&this->m_block_parent_endpoint_cluster,uVar4);
    pvVar3 = vector<basisu::vector<unsigned_int>_>::operator[](this_00,(ulong)*pbVar2);
    vector<unsigned_int>::push_back(pvVar3,(uint *)((long)&uStack_38 + 4));
  }
  uVar4 = 0;
  while( true ) {
    if ((this->m_endpoint_clusters_within_each_parent_cluster).m_size <= uVar4) {
      return;
    }
    pvVar3 = vector<basisu::vector<unsigned_int>_>::operator[](this_00,uVar4);
    if (pvVar3->m_size == 0) break;
    vector_sort<basisu::vector<unsigned_int>>(pvVar3);
    pFirst = std::__unique<unsigned_int*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                       (pvVar3->m_p,pvVar3->m_p + pvVar3->m_size);
    vector<unsigned_int>::erase(pvVar3,pFirst,pvVar3->m_p + pvVar3->m_size);
    uVar4 = uVar4 + 1;
  }
  handle_verify_failure(0x402);
}

Assistant:

void basisu_frontend::compute_endpoint_clusters_within_each_parent_cluster()
	{
		generate_block_endpoint_clusters();

		m_endpoint_clusters_within_each_parent_cluster.resize(0);
		m_endpoint_clusters_within_each_parent_cluster.resize(m_endpoint_parent_clusters.size());

		// Note: It's possible that some blocks got moved into the same cluster, but live in different parent clusters.
		for (uint32_t block_index = 0; block_index < m_total_blocks; block_index++)
		{
			const uint32_t cluster_index = m_block_endpoint_clusters_indices[block_index][0];
			const uint32_t parent_cluster_index = m_block_parent_endpoint_cluster[block_index];

			m_endpoint_clusters_within_each_parent_cluster[parent_cluster_index].push_back(cluster_index);
		}

		for (uint32_t i = 0; i < m_endpoint_clusters_within_each_parent_cluster.size(); i++)
		{
			uint_vec &cluster_indices = m_endpoint_clusters_within_each_parent_cluster[i];

			BASISU_FRONTEND_VERIFY(cluster_indices.size());

			vector_sort(cluster_indices);
			
			auto last = std::unique(cluster_indices.begin(), cluster_indices.end());
			cluster_indices.erase(last, cluster_indices.end());
		}
	}